

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int archive_read_format_iso9660_bid(archive_read *a,int best_bid)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  byte *pbStack_38;
  int seenTerminator;
  uchar *p;
  ssize_t bytes_read;
  iso9660 *iso9660;
  archive_read *paStack_18;
  int best_bid_local;
  archive_read *a_local;
  
  if (best_bid < 0x31) {
    bytes_read = (ssize_t)a->format->data;
    iso9660._4_4_ = best_bid;
    paStack_18 = a;
    pvVar3 = __archive_read_ahead(a,0xc000,(ssize_t *)&p);
    if (pvVar3 == (void *)0x0) {
      a_local._4_4_ = -1;
    }
    else {
      pbStack_38 = (byte *)((long)pvVar3 + 0x8000);
      bVar1 = false;
      for (p = p + -0x8000; 0x800 < (long)p; p = p + -0x800) {
        if ((3 < *pbStack_38) && (*pbStack_38 != 0xff)) {
          return 0;
        }
        iVar2 = memcmp(pbStack_38 + 1,"CD001",5);
        if (iVar2 != 0) {
          return 0;
        }
        iVar2 = isPVD((iso9660 *)bytes_read,pbStack_38);
        if (((iVar2 == 0) &&
            ((((*(int *)(bytes_read + 0xc4) != 0 ||
               (iVar2 = isJolietSVD((iso9660 *)bytes_read,pbStack_38), iVar2 == 0)) &&
              (iVar2 = isBootRecord((iso9660 *)bytes_read,pbStack_38), iVar2 == 0)) &&
             ((iVar2 = isEVD((iso9660 *)bytes_read,pbStack_38), iVar2 == 0 &&
              (iVar2 = isSVD((iso9660 *)bytes_read,pbStack_38), iVar2 == 0)))))) &&
           (iVar2 = isVolumePartition((iso9660 *)bytes_read,pbStack_38), iVar2 == 0)) {
          iVar2 = isVDSetTerminator((iso9660 *)bytes_read,pbStack_38);
          if (iVar2 == 0) {
            return 0;
          }
          bVar1 = true;
          break;
        }
        pbStack_38 = pbStack_38 + 0x800;
      }
      if ((bVar1) && (0x10 < *(int *)(bytes_read + 0xbc))) {
        a_local._4_4_ = 0x30;
      }
      else {
        a_local._4_4_ = 0;
      }
    }
  }
  else {
    a_local._4_4_ = -1;
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_iso9660_bid(struct archive_read *a, int best_bid)
{
	struct iso9660 *iso9660;
	ssize_t bytes_read;
	const unsigned char *p;
	int seenTerminator;

	/* If there's already a better bid than we can ever
	   make, don't bother testing. */
	if (best_bid > 48)
		return (-1);

	iso9660 = (struct iso9660 *)(a->format->data);

	/*
	 * Skip the first 32k (reserved area) and get the first
	 * 8 sectors of the volume descriptor table.  Of course,
	 * if the I/O layer gives us more, we'll take it.
	 */
#define RESERVED_AREA	(SYSTEM_AREA_BLOCK * LOGICAL_BLOCK_SIZE)
	p = __archive_read_ahead(a,
	    RESERVED_AREA + 8 * LOGICAL_BLOCK_SIZE,
	    &bytes_read);
	if (p == NULL)
	    return (-1);

	/* Skip the reserved area. */
	bytes_read -= RESERVED_AREA;
	p += RESERVED_AREA;

	/* Check each volume descriptor. */
	seenTerminator = 0;
	for (; bytes_read > LOGICAL_BLOCK_SIZE;
	    bytes_read -= LOGICAL_BLOCK_SIZE, p += LOGICAL_BLOCK_SIZE) {
		/* Do not handle undefined Volume Descriptor Type. */
		if (p[0] >= 4 && p[0] <= 254)
			return (0);
		/* Standard Identifier must be "CD001" */
		if (memcmp(p + 1, "CD001", 5) != 0)
			return (0);
		if (isPVD(iso9660, p))
			continue;
		if (!iso9660->joliet.location) {
			if (isJolietSVD(iso9660, p))
				continue;
		}
		if (isBootRecord(iso9660, p))
			continue;
		if (isEVD(iso9660, p))
			continue;
		if (isSVD(iso9660, p))
			continue;
		if (isVolumePartition(iso9660, p))
			continue;
		if (isVDSetTerminator(iso9660, p)) {
			seenTerminator = 1;
			break;
		}
		return (0);
	}
	/*
	 * ISO 9660 format must have Primary Volume Descriptor and
	 * Volume Descriptor Set Terminator.
	 */
	if (seenTerminator && iso9660->primary.location > 16)
		return (48);

	/* We didn't find a valid PVD; return a bid of zero. */
	return (0);
}